

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_program.c
# Opt level: O1

int archive_compressor_program_free(archive_write_filter *f)

{
  undefined8 *__ptr;
  
  __ptr = (undefined8 *)f->data;
  if (__ptr != (undefined8 *)0x0) {
    free((void *)__ptr[4]);
    archive_string_free((archive_string *)(__ptr + 1));
    __archive_write_program_free((archive_write_program_data *)*__ptr);
    free(__ptr);
    f->data = (void *)0x0;
  }
  return 0;
}

Assistant:

static int
archive_compressor_program_free(struct archive_write_filter *f)
{
	struct private_data *data = (struct private_data *)f->data;

	if (data) {
		free(data->cmd);
		archive_string_free(&data->description);
		__archive_write_program_free(data->pdata);
		free(data);
		f->data = NULL;
	}
	return (ARCHIVE_OK);
}